

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv_run(uv_loop_t *loop,uv_run_mode mode)

{
  uv__queue *puVar1;
  long *plVar2;
  uint *puVar3;
  uv_stream_t *puVar4;
  int iVar5;
  uint64_t uVar6;
  uint uVar7;
  uv_stream_t *stream;
  bool bVar8;
  
  if ((((loop->active_handles == 0) && ((loop->active_reqs).count == 0)) &&
      ((loop->pending_queue).next == &loop->pending_queue)) &&
     (loop->closing_handles == (uv_handle_t *)0x0)) {
    uVar6 = uv__hrtime(UV_CLOCK_FAST);
    loop->time = uVar6 / 1000000;
    uVar7 = 0;
LAB_001e4757:
    if (loop->stop_flag != 0) {
      loop->stop_flag = 0;
    }
    return uVar7;
  }
  puVar1 = &loop->pending_queue;
LAB_001e458d:
  if (loop->stop_flag == 0) {
    bVar8 = false;
    if (puVar1->next == puVar1) {
      bVar8 = (loop->idle_handles).next == &loop->idle_handles;
    }
    uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);
    iVar5 = 0;
    if ((mode == UV_RUN_DEFAULT) || ((bool)(mode == UV_RUN_ONCE & bVar8))) {
      iVar5 = uv__backend_timeout(loop);
    }
    plVar2 = (long *)((long)loop->internal_fields + 8);
    *plVar2 = *plVar2 + 1;
    uv__io_poll(loop,iVar5);
    iVar5 = 8;
    do {
      if (puVar1->next == puVar1) break;
      uv__run_pending(loop);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    uv__metrics_update_idle_time(loop);
    uv__run_check(loop);
    puVar4 = (uv_stream_t *)loop->closing_handles;
    loop->closing_handles = (uv_handle_t *)0x0;
LAB_001e4634:
    stream = puVar4;
    if (stream == (uv_stream_t *)0x0) goto LAB_001e46f2;
    uVar7 = stream->flags;
    if ((uVar7 & 1) == 0) {
      __assert_fail("handle->flags & UV_HANDLE_CLOSING",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                    ,0x125,"void uv__finish_close(uv_handle_t *)");
    }
    if ((uVar7 & 2) != 0) {
      __assert_fail("!(handle->flags & UV_HANDLE_CLOSED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                    ,0x126,"void uv__finish_close(uv_handle_t *)");
    }
    puVar4 = (uv_stream_t *)stream->next_closing;
    stream->flags = uVar7 | 2;
    switch(stream->type) {
    case UV_ASYNC:
    case UV_CHECK:
    case UV_FS_EVENT:
    case UV_FS_POLL:
    case UV_IDLE:
    case UV_POLL:
    case UV_PREPARE:
    case UV_PROCESS:
    case UV_TIMER:
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                    ,0x14e,"void uv__finish_close(uv_handle_t *)");
    case UV_NAMED_PIPE:
    case UV_TCP:
    case UV_TTY:
      uv__stream_destroy(stream);
      break;
    case UV_UDP:
      uv__udp_finish_close((uv_udp_t *)stream);
      break;
    case UV_SIGNAL:
      if (*(uint *)&(stream->io_watcher).pending_queue.next <=
          *(uint *)((long)&(stream->io_watcher).pending_queue.next + 4)) break;
      stream->flags = uVar7;
      uv__make_close_pending((uv_handle_t *)stream);
      goto LAB_001e4634;
    }
    uVar7 = stream->flags;
    if (((uVar7 & 8) != 0) && (stream->flags = uVar7 & 0xfffffff7, (uVar7 & 5) == 4)) {
      puVar3 = &stream->loop->active_handles;
      *puVar3 = *puVar3 - 1;
    }
    ((stream->handle_queue).prev)->next = (stream->handle_queue).next;
    ((stream->handle_queue).next)->prev = (stream->handle_queue).prev;
    if (stream->close_cb != (uv_close_cb)0x0) {
      (*stream->close_cb)((uv_handle_t *)stream);
    }
    goto LAB_001e4634;
  }
  uVar7 = 1;
  goto LAB_001e4757;
LAB_001e46f2:
  uVar7 = 1;
  uVar6 = uv__hrtime(UV_CLOCK_FAST);
  loop->time = uVar6 / 1000000;
  uv__run_timers(loop);
  if (((loop->active_handles == 0) && ((loop->active_reqs).count == 0)) && (puVar1->next == puVar1))
  {
    uVar7 = (uint)(loop->closing_handles != (uv_handle_t *)0x0);
  }
  if ((0xfffffffd < mode + ~UV_RUN_NOWAIT) || (uVar7 == 0)) goto LAB_001e4757;
  goto LAB_001e458d;
}

Assistant:

int uv_run(uv_loop_t* loop, uv_run_mode mode) {
  int timeout;
  int r;
  int can_sleep;

  r = uv__loop_alive(loop);
  if (!r)
    uv__update_time(loop);

  while (r != 0 && loop->stop_flag == 0) {
    can_sleep =
        uv__queue_empty(&loop->pending_queue) &&
        uv__queue_empty(&loop->idle_handles);

    uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);

    timeout = 0;
    if ((mode == UV_RUN_ONCE && can_sleep) || mode == UV_RUN_DEFAULT)
      timeout = uv__backend_timeout(loop);

    uv__metrics_inc_loop_count(loop);

    uv__io_poll(loop, timeout);

    /* Process immediate callbacks (e.g. write_cb) a small fixed number of
     * times to avoid loop starvation.*/
    for (r = 0; r < 8 && !uv__queue_empty(&loop->pending_queue); r++)
      uv__run_pending(loop);

    /* Run one final update on the provider_idle_time in case uv__io_poll
     * returned because the timeout expired, but no events were received. This
     * call will be ignored if the provider_entry_time was either never set (if
     * the timeout == 0) or was already updated b/c an event was received.
     */
    uv__metrics_update_idle_time(loop);

    uv__run_check(loop);
    uv__run_closing_handles(loop);

    uv__update_time(loop);
    uv__run_timers(loop);

    r = uv__loop_alive(loop);
    if (mode == UV_RUN_ONCE || mode == UV_RUN_NOWAIT)
      break;
  }

  /* The if statement lets gcc compile it to a conditional store. Avoids
   * dirtying a cache line.
   */
  if (loop->stop_flag != 0)
    loop->stop_flag = 0;

  return r;
}